

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_quot(LispPTR tosm1,LispPTR tos)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  int *fixpp;
  int result;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tosm1 & 0xfff0000) == 0xe0000) {
    result = tosm1 & 0xffff;
LAB_001096c3:
    if ((tos & 0xfff0000) == 0xe0000) {
      fixpp._4_4_ = tos & 0xffff;
    }
    else if ((tos & 0xfff0000) == 0xf0000) {
      fixpp._4_4_ = tos | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001097d6;
      pLVar2 = NativeAligned4FromLAddr(tos);
      fixpp._4_4_ = *pLVar2;
    }
    if (fixpp._4_4_ == 0) {
      MachineState.errorexit = 1;
      tos_local = 0xffffffff;
      MachineState.tosvalue = tos;
    }
    else {
      uVar1 = result / (int)fixpp._4_4_;
      if (uVar1 >> 0x10 == 0xffff) {
        tos_local = uVar1 & 0xffff | 0xf0000;
      }
      else if (uVar1 >> 0x10 == 0) {
        tos_local = uVar1 | 0xe0000;
      }
      else {
        NAddr = (uint *)createcell68k(2);
        *NAddr = uVar1;
        tos_local = LAddrFromNative(NAddr);
      }
    }
  }
  else {
    if ((tosm1 & 0xfff0000) == 0xf0000) {
      result = tosm1 | 0xffff0000;
      goto LAB_001096c3;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar2 = NativeAligned4FromLAddr(tosm1);
      result = *pLVar2;
      goto LAB_001096c3;
    }
LAB_001097d6:
    tos_local = N_OP_fquotient(tosm1,tos);
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_quot(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;
  int result;

  N_GETNUMBER(tosm1, arg1, doufn);
  N_GETNUMBER(tos, arg2, doufn);
  if (arg2 == 0) goto doufn2;

  result = arg1 / arg2; /* lmm: note: no error case!! */
  N_ARITH_SWITCH(result);

doufn2:
  ERROR_EXIT(tos);
doufn:
  return (N_OP_fquotient(tosm1, tos));

}